

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgettextcontrol_p.cpp
# Opt level: O2

void QWidgetTextControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined1 *puVar2;
  PrivateShared *pPVar3;
  undefined1 *puVar4;
  bool bVar5;
  undefined1 uVar6;
  int iVar7;
  Mode mode;
  QString *text;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined1 *puStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        textChanged((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        undoAvailable((QWidgetTextControl *)_o,*_a[1]);
        return;
      }
      break;
    case 2:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        redoAvailable((QWidgetTextControl *)_o,*_a[1]);
        return;
      }
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        currentCharFormatChanged((QWidgetTextControl *)_o,(QTextCharFormat *)_a[1]);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        copyAvailable((QWidgetTextControl *)_o,*_a[1]);
        return;
      }
      break;
    case 5:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        selectionChanged((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 6:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        cursorPositionChanged((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 7:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        updateRequest((QWidgetTextControl *)_o,(QRectF *)_a[1]);
        return;
      }
      break;
    case 8:
      local_38._16_8_ = (undefined1 *)0x0;
      puStack_20 = (undefined1 *)0x0;
      local_38.shared = (PrivateShared *)0x0;
      local_38._8_8_ = (undefined1 *)0x0;
      updateRequest((QWidgetTextControl *)_o,(QRectF *)&local_38);
      goto switchD_00484e50_caseD_3;
    case 9:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        documentSizeChanged((QWidgetTextControl *)_o,(QSizeF *)_a[1]);
        return;
      }
      break;
    case 10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        blockCountChanged((QWidgetTextControl *)_o,*_a[1]);
        return;
      }
      break;
    case 0xb:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        visibilityRequest((QWidgetTextControl *)_o,(QRectF *)_a[1]);
        return;
      }
      break;
    case 0xc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        microFocusChanged((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0xd:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        linkActivated((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0xe:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        linkHovered((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0xf:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        blockMarkerHovered((QWidgetTextControl *)_o,(QTextBlock *)_a[1]);
        return;
      }
      break;
    case 0x10:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        modificationChanged((QWidgetTextControl *)_o,*_a[1]);
        return;
      }
      break;
    case 0x11:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setPlainText((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x12:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setMarkdown((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x13:
      text = (QString *)_a[1];
switchD_00484eaa_caseD_0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setHtml((QWidgetTextControl *)_o,text);
        return;
      }
      break;
    case 0x14:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        cut((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x15:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        copy((QWidgetTextControl *)_o,(EVP_PKEY_CTX *)&switchD_00484e50::switchdataD_00667f54,
             (EVP_PKEY_CTX *)&switchD_00484e6a::switchdataD_00667fa4);
        return;
      }
      break;
    case 0x16:
      mode = *_a[1];
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
LAB_004856b0:
        paste((QWidgetTextControl *)_o,mode);
        return;
      }
      break;
    case 0x17:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        mode = Clipboard;
        goto LAB_004856b0;
      }
      break;
    case 0x18:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        undo((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x19:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        redo((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x1a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        clear((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x1b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        selectAll((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x1c:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        insertPlainText((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        insertHtml((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1e:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        append((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x1f:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        appendHtml((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x20:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        appendPlainText((QWidgetTextControl *)_o,(QString *)_a[1]);
        return;
      }
      break;
    case 0x21:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        adjustSize((QWidgetTextControl *)_o);
        return;
      }
      break;
    case 0x22:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetTextControlPrivate::_q_deleteSelected(*(QWidgetTextControlPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x23:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QWidgetTextControlPrivate::_q_copyLink(*(QWidgetTextControlPrivate **)(_o + 8));
        return;
      }
      break;
    case 0x24:
      local_38._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)_o + 0x68))(&local_38,_o,*_a[1],_a[2]);
      if ((QVariant *)*_a != (QVariant *)0x0) {
        ::QVariant::operator=((QVariant *)*_a,(QVariant *)&local_38);
      }
      ::QVariant::~QVariant((QVariant *)&local_38);
    default:
      goto switchD_00484e50_caseD_3;
    }
    goto LAB_00485721;
  case ReadProperty:
    if (6 < (uint)_id) break;
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      toHtml((QString *)&local_38,(QWidgetTextControl *)_o);
      pPVar3 = *(PrivateShared **)piVar1;
      puVar4 = *(undefined1 **)(piVar1 + 2);
      *(PrivateShared **)piVar1 = local_38.shared;
      *(undefined8 *)(piVar1 + 2) = local_38._8_8_;
      puVar2 = *(undefined1 **)(piVar1 + 4);
      *(undefined8 *)(piVar1 + 4) = local_38._16_8_;
      local_38.shared = pPVar3;
      local_38._8_8_ = puVar4;
      local_38._16_8_ = puVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
      goto switchD_00484e50_caseD_3;
    case 1:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x110);
      break;
    case 2:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x111);
      break;
    case 3:
      iVar7 = cursorWidth((QWidgetTextControl *)_o);
      goto LAB_004851a4;
    case 4:
      iVar7 = *(int *)(*(long *)(_o + 8) + 0xb0);
LAB_004851a4:
      *piVar1 = iVar7;
      goto switchD_00484e50_caseD_3;
    case 5:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x192);
      break;
    case 6:
      uVar6 = *(undefined1 *)(*(long *)(_o + 8) + 0x191);
    }
    *(undefined1 *)piVar1 = uVar6;
    break;
  case WriteProperty:
    if (6 < (uint)_id) break;
    text = (QString *)*_a;
    switch(_id) {
    case 0:
      goto switchD_00484eaa_caseD_0;
    case 1:
      *(undefined1 *)(*(long *)(_o + 8) + 0x110) = *(undefined1 *)&(text->d).d;
      break;
    case 2:
      *(undefined1 *)(*(long *)(_o + 8) + 0x111) = *(undefined1 *)&(text->d).d;
      break;
    case 3:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setCursorWidth((QWidgetTextControl *)_o,*(int *)&(text->d).d);
        return;
      }
      goto LAB_00485721;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        setTextInteractionFlags
                  ((QWidgetTextControl *)_o,
                   (QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
                   *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)&(text->d).d);
        return;
      }
      goto LAB_00485721;
    case 5:
      *(undefined1 *)(*(long *)(_o + 8) + 0x192) = *(undefined1 *)&(text->d).d;
      break;
    case 6:
      *(undefined1 *)(*(long *)(_o + 8) + 0x191) = *(undefined1 *)&(text->d).d;
    }
    break;
  case IndexOfMethod:
    bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                      ((QtMocHelpers *)_a,(void **)textChanged,0,0);
    if (((((!bVar5) &&
          (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                             ((QtMocHelpers *)_a,(void **)undoAvailable,0,1), !bVar5)) &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                            ((QtMocHelpers *)_a,(void **)redoAvailable,0,2), !bVar5)) &&
        (((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QTextCharFormat_const&)>
                             ((QtMocHelpers *)_a,(void **)currentCharFormatChanged,0,3), !bVar5 &&
          (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                             ((QtMocHelpers *)_a,(void **)copyAvailable,0,4), !bVar5)) &&
         ((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                             ((QtMocHelpers *)_a,(void **)selectionChanged,0,5), !bVar5 &&
          ((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                              ((QtMocHelpers *)_a,(void **)cursorPositionChanged,0,6), !bVar5 &&
           (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QRectF_const&)>
                              ((QtMocHelpers *)_a,(void **)updateRequest,0,7), !bVar5)))))))) &&
       ((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QSizeF_const&)>
                           ((QtMocHelpers *)_a,(void **)documentSizeChanged,0,9), !bVar5 &&
        (((((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(int)>
                               ((QtMocHelpers *)_a,(void **)blockCountChanged,0,10), !bVar5 &&
            (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QRectF_const&)>
                               ((QtMocHelpers *)_a,(void **)visibilityRequest,0,0xb), !bVar5)) &&
           (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)()>
                              ((QtMocHelpers *)_a,(void **)microFocusChanged,0,0xc), !bVar5)) &&
          ((bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QString_const&)>
                              ((QtMocHelpers *)_a,(void **)linkActivated,0,0xd), !bVar5 &&
           (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QString_const&)>
                              ((QtMocHelpers *)_a,(void **)linkHovered,0,0xe), !bVar5)))) &&
         (bVar5 = QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(QTextBlock_const&)>
                            ((QtMocHelpers *)_a,(void **)blockMarkerHovered,0,0xf), !bVar5)))))) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        QtMocHelpers::indexOfMethod<void(QWidgetTextControl::*)(bool)>
                  ((QtMocHelpers *)_a,(void **)modificationChanged,0,0x10);
        return;
      }
      goto LAB_00485721;
    }
  }
switchD_00484e50_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_00485721:
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetTextControl *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->updateRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 8: _t->updateRequest(); break;
        case 9: _t->documentSizeChanged((*reinterpret_cast< std::add_pointer_t<QSizeF>>(_a[1]))); break;
        case 10: _t->blockCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 11: _t->visibilityRequest((*reinterpret_cast< std::add_pointer_t<QRectF>>(_a[1]))); break;
        case 12: _t->microFocusChanged(); break;
        case 13: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 14: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 15: _t->blockMarkerHovered((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 16: _t->modificationChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 17: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste((*reinterpret_cast< std::add_pointer_t<QClipboard::Mode>>(_a[1]))); break;
        case 23: _t->paste(); break;
        case 24: _t->undo(); break;
        case 25: _t->redo(); break;
        case 26: _t->clear(); break;
        case 27: _t->selectAll(); break;
        case 28: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->appendHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 32: _t->appendPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 33: _t->adjustSize(); break;
        case 34: _t->d_func()->_q_deleteSelected(); break;
        case 35: _t->d_func()->_q_copyLink(); break;
        case 36: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextCharFormat & )>(_a, &QWidgetTextControl::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::cursorPositionChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::updateRequest, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QSizeF & )>(_a, &QWidgetTextControl::documentSizeChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(int )>(_a, &QWidgetTextControl::blockCountChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QRectF & )>(_a, &QWidgetTextControl::visibilityRequest, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)()>(_a, &QWidgetTextControl::microFocusChanged, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkActivated, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QString & )>(_a, &QWidgetTextControl::linkHovered, 14))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(const QTextBlock & )>(_a, &QWidgetTextControl::blockMarkerHovered, 15))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWidgetTextControl::*)(bool )>(_a, &QWidgetTextControl::modificationChanged, 16))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 3: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 4: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->ignoreUnusedNavigationEvents(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 4: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 5: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setIgnoreUnusedNavigationEvents(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}